

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getVarTypeSize(VarType *type)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  int iVar4;
  StructType *pSVar5;
  StructMember *this;
  VarType *pVVar6;
  undefined4 local_20;
  undefined4 local_1c;
  int ndx;
  int size;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(type);
    iVar3 = glu::getDataTypeScalarSize(DVar2);
    DVar2 = glu::VarType::getBasicType(type);
    DVar2 = glu::getDataTypeScalarType(DVar2);
    iVar4 = getTypeSize(DVar2);
    type_local._4_4_ = iVar3 * iVar4;
  }
  else {
    bVar1 = glu::VarType::isStructType(type);
    if (bVar1) {
      local_1c = 0;
      local_20 = 0;
      while( true ) {
        pSVar5 = glu::VarType::getStructPtr(type);
        iVar3 = glu::StructType::getNumMembers(pSVar5);
        if (iVar3 <= local_20) break;
        pSVar5 = glu::VarType::getStructPtr(type);
        this = glu::StructType::getMember(pSVar5,local_20);
        pVVar6 = glu::StructMember::getType(this);
        iVar3 = getVarTypeSize(pVVar6);
        local_1c = iVar3 + local_1c;
        local_20 = local_20 + 1;
      }
      type_local._4_4_ = local_1c;
    }
    else {
      bVar1 = glu::VarType::isArrayType(type);
      if (bVar1) {
        iVar3 = glu::VarType::getArraySize(type);
        if (iVar3 == -1) {
          pVVar6 = glu::VarType::getElementType(type);
          type_local._4_4_ = getVarTypeSize(pVVar6);
        }
        else {
          iVar3 = glu::VarType::getArraySize(type);
          pVVar6 = glu::VarType::getElementType(type);
          iVar4 = getVarTypeSize(pVVar6);
          type_local._4_4_ = iVar3 * iVar4;
        }
      }
      else {
        type_local._4_4_ = 0;
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

static int getVarTypeSize (const glu::VarType& type)
{
	if (type.isBasicType())
	{
		// return in basic machine units
		return glu::getDataTypeScalarSize(type.getBasicType()) * getTypeSize(glu::getDataTypeScalarType(type.getBasicType()));
	}
	else if (type.isStructType())
	{
		int size = 0;
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			size += getVarTypeSize(type.getStructPtr()->getMember(ndx).getType());
		return size;
	}
	else if (type.isArrayType())
	{
		// unsized arrays are handled as if they had only one element
		if (type.getArraySize() == glu::VarType::UNSIZED_ARRAY)
			return getVarTypeSize(type.getElementType());
		else
			return type.getArraySize() * getVarTypeSize(type.getElementType());
	}
	else
	{
		DE_ASSERT(false);
		return 0;
	}
}